

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiWindow * FindWindowNavFocusable(int i_start,int i_stop,int dir)

{
  ImGuiWindow *pIVar1;
  int i;
  
  if (-1 < i_start) {
    do {
      if (i_stop == i_start) {
        return (ImGuiWindow *)0x0;
      }
      if ((GImGui->WindowsFocusOrder).Size <= i_start) {
        return (ImGuiWindow *)0x0;
      }
      pIVar1 = (GImGui->WindowsFocusOrder).Data[(uint)i_start];
      if (((pIVar1->Active == true) && (pIVar1->RootWindow == pIVar1)) &&
         ((pIVar1->Flags & 0x80000) == 0)) {
        return pIVar1;
      }
      i_start = i_start + dir;
    } while (-1 < i_start);
  }
  return (ImGuiWindow *)0x0;
}

Assistant:

static ImGuiWindow* FindWindowNavFocusable(int i_start, int i_stop, int dir) // FIXME-OPT O(N)
{
    ImGuiContext& g = *GImGui;
    for (int i = i_start; i >= 0 && i < g.WindowsFocusOrder.Size && i != i_stop; i += dir)
        if (ImGui::IsWindowNavFocusable(g.WindowsFocusOrder[i]))
            return g.WindowsFocusOrder[i];
    return NULL;
}